

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::delinearize_metrics_dim<1>(Omega_h *this,Reals *lms)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO size_in;
  size_t sVar2;
  Reals RVar3;
  type f;
  Write<double> out;
  allocator local_59;
  string local_58;
  Write<double> local_38;
  Write<signed_char> local_28;
  
  pAVar1 = (lms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  size_in = (LO)(sVar2 >> 3);
  Write<double>::Write(&local_38,size_in,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<double>::Write((Write<double> *)&local_58,&local_38);
  Write<double>::Write((Write<double> *)&local_58.field_2,&lms->write_);
  parallel_for<Omega_h::delinearize_metrics_dim<1>(Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,(type *)&local_58,"delinearize_metrics");
  Write<double>::Write(&local_28,(Write<signed_char> *)&local_38);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_28);
  Write<double>::~Write((Write<double> *)&local_28);
  delinearize_metrics_dim<1>(Omega_h::Read<double>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_58);
  Write<double>::~Write(&local_38);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals delinearize_metrics_dim(Reals lms) {
  auto n = divide_no_remainder(lms.size(), symm_ncomps(dim));
  auto out = Write<Real>(n * symm_ncomps(dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_symm(out, i, delinearize_metric(get_symm<dim>(lms, i)));
  };
  parallel_for(n, f, "delinearize_metrics");
  return out;
}